

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

ProString * __thiscall
ProString::operator=
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
          *str)

{
  long lVar1;
  ProString *pPVar2;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
  *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff78);
  ProString(in_RDI,(QString *)in_stack_ffffffffffffff78);
  pPVar2 = operator=(in_RDI,(ProString *)in_stack_ffffffffffffff78);
  ~ProString((ProString *)0x2266f6);
  QString::~QString((QString *)0x226700);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator=(const QStringBuilder<A, B> &str)
    { return *this = QString(str); }